

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O0

A * __thiscall hiberlite::real_bean<A>::get(real_bean<A> *this)

{
  runtime_error *this_00;
  real_bean<A> *this_local;
  
  if ((this->forgotten & 1U) == 0) {
    loadLazy(this);
    if (this->obj == (A *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"NULL pointer exception!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local = (real_bean<A> *)this->obj;
  }
  else {
    this_local = (real_bean<A> *)0x0;
  }
  return (A *)this_local;
}

Assistant:

C* real_bean<C>::get()
{
	if(forgotten)
		return NULL;
	loadLazy();
	if(!obj)
		throw std::runtime_error("NULL pointer exception!");
	return obj;
}